

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_IsPointGridClosed
               (int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
               int point_stride1,double *p,int dir)

{
  int iVar1;
  bool bVar2;
  
  if (p == (double *)0x0 || (point_count1 < 1 || point_count0 < 1)) {
    bVar2 = false;
  }
  else {
    iVar1 = (point_count0 + -1) * point_stride0;
    if (dir != 0) {
      iVar1 = (point_count1 + -1) * point_stride1;
      point_count1 = point_count0;
      point_stride1 = point_stride0;
    }
    iVar1 = ON_ComparePointList(dim,is_rat,point_count1,point_stride1,p,point_stride1,p + iVar1);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool 
ON_IsPointGridClosed(
        int dim,
        bool is_rat,
        int point_count0, int point_count1,
        int point_stride0, int point_stride1,
        const double* p,
        int dir
       )
{
  bool rc = false;
  if ( point_count0>0 && point_count1>0 && p != nullptr ) {
    int count, stride;
    const double* p0;
    const double* p1;
    if ( dir ) {
      p0 = p;
      p1 = p + (point_count1-1)*point_stride1;
      count = point_count0;
      stride = point_stride0;
    }
    else {
      p0 = p;
      p1 = p + (point_count0-1)*point_stride0;
      count = point_count1;
      stride = point_stride1;
    }
    rc = (0==ON_ComparePointList( dim, is_rat, count, stride, p0, stride, p1 ))?true:false;
  }
  return rc;
}